

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractMuxer.h
# Opt level: O2

string * __thiscall
AbstractMuxer::getNextName(string *__return_storage_ptr__,AbstractMuxer *this,string *curName)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)curName);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string getNextName(std::string curName) { return curName; }